

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * vera::toSdf(Image *__return_storage_ptr__,Mesh *_mesh,float _paddingPct,int _resolution)

{
  double dVar1;
  double dVar2;
  pointer ptVar3;
  int iVar4;
  int iVar5;
  size_t _width;
  int iVar6;
  thread *t_1;
  pointer ptVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar11;
  float fVar12;
  thread t;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> tris;
  Mesh mesh;
  thread local_1c8;
  long *local_1c0;
  vector<std::thread,_std::allocator<std::thread>_> local_1b8;
  float local_198;
  int iStack_194;
  undefined8 uStack_190;
  ulong local_188;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> local_180;
  float local_168;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_164;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_160;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  BVH local_140;
  Mesh local_d8;
  
  Mesh::Mesh(&local_d8,_mesh);
  center(&local_d8.m_vertices);
  Mesh::getTriangles(&local_180,&local_d8);
  BVH::BVH(&local_140,&local_180,SPLIT_MIDPOINT);
  BoundingBox::square(&local_140.super_BoundingBox);
  aStack_164 = local_140.super_BoundingBox.max.field_2;
  local_158 = local_140.super_BoundingBox.max.field_0.x - local_140.super_BoundingBox.min.field_0.x;
  fStack_154 = local_140.super_BoundingBox.max.field_1.y - local_140.super_BoundingBox.min.field_1.y
  ;
  fStack_150 = local_140.super_BoundingBox.min.field_2.z - local_140.super_BoundingBox.min.field_2.z
  ;
  fStack_14c = local_140.super_BoundingBox.max.field_0.x - local_140.super_BoundingBox.max.field_0.x
  ;
  local_168 = aStack_164.z - local_140.super_BoundingBox.min.field_2.z;
  fVar11 = SQRT(fStack_154 * fStack_154 + local_158 * local_158 + local_168 * local_168);
  fVar12 = fVar11 * fVar11 * _paddingPct;
  local_140.super_BoundingBox.min.field_0.x = local_140.super_BoundingBox.min.field_0.x - fVar12;
  local_140.super_BoundingBox.min.field_1.y = local_140.super_BoundingBox.min.field_1.y - fVar12;
  local_140.super_BoundingBox.min.field_2.z = local_140.super_BoundingBox.min.field_2.z - fVar12;
  local_140.super_BoundingBox.max.field_0.x = local_140.super_BoundingBox.max.field_0.x + fVar12;
  local_140.super_BoundingBox.max.field_1.y = fVar12 + local_140.super_BoundingBox.max.field_1.y;
  local_140.super_BoundingBox.max.field_2.z = fVar12 + aStack_164.z;
  aStack_160 = aStack_164;
  aStack_15c = aStack_164;
  dVar1 = ldexp(1.0,_resolution);
  local_198 = (float)(int)dVar1;
  iStack_194 = (int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  uStack_190 = 0;
  dVar2 = (double)(int)local_198;
  if (dVar2 < 0.0) {
    dVar2 = ::sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  Image::Image(__return_storage_ptr__);
  iVar9 = (int)dVar1;
  _width = (size_t)((int)dVar2 * iVar9);
  Image::allocate(__return_storage_ptr__,_width,_width,1);
  iVar4 = std::thread::hardware_concurrency();
  local_188 = (long)iVar9 / (long)iVar4 & 0xffffffff;
  iVar10 = iVar9 % iVar4;
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < iVar4) {
    local_198 = 1.0 / (float)(int)local_198;
    iVar8 = 0;
    do {
      local_1c8._M_id._M_thread = (id)0;
      local_1c0 = (long *)operator_new(0x40);
      iVar5 = 0;
      if (iVar4 == 1) {
        iVar5 = iVar10;
      }
      iVar6 = (int)local_188 + iVar8;
      *local_1c0 = (long)&PTR___State_003da3d0;
      local_1c0[1] = (long)&local_140;
      local_1c0[2] = (long)__return_storage_ptr__;
      *(int *)(local_1c0 + 3) = iVar8;
      *(int *)((long)local_1c0 + 0x1c) = iVar5 + iVar6;
      *(int *)(local_1c0 + 4) = iVar9;
      *(float *)((long)local_1c0 + 0x24) = local_198;
      *(int *)(local_1c0 + 5) = (int)dVar2;
      *(ulong *)((long)local_1c0 + 0x2c) = CONCAT44(fStack_154,local_158);
      *(float *)((long)local_1c0 + 0x34) = local_168;
      *(float *)(local_1c0 + 7) = fVar11 * 0.5;
      std::thread::_M_start_thread(&local_1c8,&local_1c0,0);
      if (local_1c0 != (long *)0x0) {
        (**(code **)(*local_1c0 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_1b8,&local_1c8);
      ptVar3 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_1c8._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar4 = iVar4 + -1;
      ptVar7 = local_1b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = iVar6;
    } while (iVar4 != 0);
    for (; ptVar7 != ptVar3; ptVar7 = ptVar7 + 1) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_1b8);
  BVH::~BVH(&local_140);
  std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(&local_180);
  Mesh::~Mesh(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Image   toSdf(const Mesh& _mesh, float _paddingPct, int _resolution) {
    Mesh mesh = _mesh;
    center(mesh);
    std::vector<Triangle> tris = mesh.getTriangles();
    BVH acc(tris, vera::SPLIT_MIDPOINT);

    acc.square();

    glm::vec3   bdiagonal   = acc.getDiagonal();
    float       max_dist    = glm::length(bdiagonal);
    acc.expand( (max_dist*max_dist) * _paddingPct );

    int    voxel_resolution = std::pow(2, _resolution);
    float        voxel_size = 1.0/float(voxel_resolution);
    int         layersTotal = std::sqrt(voxel_resolution);
    int    image_resolution = voxel_resolution * layersTotal;

    Image rta;
    rta.allocate(image_resolution, image_resolution, 1);

    const int nThreads  = std::thread::hardware_concurrency();
    int layersPerThread = voxel_resolution / nThreads;
    int layersLeftOver  = voxel_resolution % nThreads;
    max_dist *= 0.5f;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_layer = i * layersPerThread;
        int end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&acc, &rta, start_layer, end_layer, voxel_resolution, voxel_size, layersTotal, bdiagonal, max_dist ]() {
                for (int z = start_layer; z < end_layer; z++)
                for (int y = 0; y < voxel_resolution; y++)
                for (int x = 0; x < voxel_resolution; x++) {
                    // for each voxel convert it into a point in the space containing a mesh
                    glm::vec3 p = glm::vec3(x, y, z) * voxel_size;
                    p = acc.min + p * bdiagonal;

                    glm::vec4 c = acc.getClosestRGBSignedDistance(p);
                    c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                    size_t layerX = (z % layersTotal) * voxel_resolution; 
                    size_t layerY = floor(z / layersTotal) * voxel_resolution;
                    rta.setColor(rta.getIndex(layerX + x, layerY + y), c);
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return rta;
}